

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestNetworkAdapter>::disposeImpl
          (HeapDisposer<capnp::_::(anonymous_namespace)::TestNetworkAdapter> *this,void *pointer)

{
  void *pointer_local;
  HeapDisposer<capnp::_::(anonymous_namespace)::TestNetworkAdapter> *this_local;
  
  if (pointer != (void *)0x0) {
    capnp::_::anon_unknown_0::TestNetworkAdapter::~TestNetworkAdapter((TestNetworkAdapter *)pointer)
    ;
    operator_delete(pointer,0xe8);
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }